

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse
          (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this)

{
  SListNodeBase<Memory::Recycler> *pSVar1;
  bool bVar2;
  WriteBarrierPtr *pWVar3;
  SListNodeBase<Memory::Recycler> **ppSVar4;
  Type *pTVar5;
  NodeBase *next;
  NodeBase *current;
  NodeBase *prev;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this_local;
  
  pWVar3 = (WriteBarrierPtr *)
           SListNodeBase<Memory::Recycler>::Next(&this->super_SListNodeBase<Memory::Recycler>);
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__(pWVar3);
  next = *ppSVar4;
  current = &this->super_SListNodeBase<Memory::Recycler>;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pWVar3 = (WriteBarrierPtr *)SListNodeBase<Memory::Recycler>::Next(next);
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__(pWVar3);
    pSVar1 = *ppSVar4;
    pTVar5 = SListNodeBase<Memory::Recycler>::Next(next);
    Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=(pTVar5,current);
    current = next;
    next = pSVar1;
  }
  pTVar5 = SListNodeBase<Memory::Recycler>::Next(next);
  Memory::WriteBarrierPtr<SListNodeBase<Memory::Recycler>_>::operator=(pTVar5,current);
  return;
}

Assistant:

void Reverse()
    {
        NodeBase * prev = this;
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            current->Next() = prev;
            prev = current;
            current = next;
        }
        current->Next() = prev;
    }